

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogl_draw.c
# Opt level: O0

void ogl_draw_pixel(ALLEGRO_DISPLAY *d,float x,float y,ALLEGRO_COLOR *color)

{
  _Bool _Var1;
  ALLEGRO_BITMAP *bitmap;
  undefined8 *in_RSI;
  long in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  GLfloat color_array [4];
  GLfloat vert [2];
  ALLEGRO_BITMAP_EXTRA_OPENGL *ogl_target;
  ALLEGRO_BITMAP *target;
  undefined4 uVar2;
  undefined4 uVar3;
  int stride;
  GLint in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  void *pvVar4;
  
  bitmap = al_get_target_bitmap();
  if (bitmap->parent != (ALLEGRO_BITMAP *)0x0) {
    bitmap = bitmap->parent;
  }
  pvVar4 = bitmap->extra;
  if (((((*(byte *)((long)pvVar4 + 0x38) & 1) == 0) &&
       (*(ALLEGRO_BITMAP **)(*(long *)(in_RDI + 0x160) + 0x38) != bitmap)) ||
      ((bitmap->locked & 1U) != 0)) ||
     (_Var1 = _al_opengl_set_blender((ALLEGRO_DISPLAY *)CONCAT44(x,y)), !_Var1)) {
    _al_draw_pixel_memory
              (bitmap,(float)((ulong)pvVar4 >> 0x20),SUB84(pvVar4,0),
               (ALLEGRO_COLOR *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  else {
    uVar2 = *(undefined4 *)in_RSI;
    uVar3 = *(undefined4 *)((long)in_RSI + 4);
    stride = *(int *)((long)in_RSI + 0xc);
    vert_ptr_on((ALLEGRO_DISPLAY *)CONCAT44(in_XMM1_Da,in_XMM0_Da),in_stack_ffffffffffffffcc,
                in_stack_ffffffffffffffc8,stride,(void *)*in_RSI);
    color_ptr_on((ALLEGRO_DISPLAY *)CONCAT44(in_XMM1_Da,in_XMM0_Da),in_stack_ffffffffffffffcc,
                 in_stack_ffffffffffffffc8,stride,(void *)CONCAT44(uVar3,uVar2));
    _Var1 = _al_opengl_set_blender((ALLEGRO_DISPLAY *)CONCAT44(x,y));
    if (_Var1) {
      glDrawArrays(0,0,1);
      vert_ptr_off((ALLEGRO_DISPLAY *)0x2317f8);
      color_ptr_off((ALLEGRO_DISPLAY *)0x231802);
    }
  }
  return;
}

Assistant:

static void ogl_draw_pixel(ALLEGRO_DISPLAY *d, float x, float y,
   ALLEGRO_COLOR *color)
{
   ALLEGRO_BITMAP *target = al_get_target_bitmap();
   ALLEGRO_BITMAP_EXTRA_OPENGL *ogl_target;
   GLfloat vert[2];
   GLfloat color_array[4];

   /* For sub-bitmaps */
   if (target->parent) {
      target = target->parent;
   }

   ogl_target = target->extra;

   if ((!ogl_target->is_backbuffer &&
      d->ogl_extras->opengl_target != target) ||
      target->locked || !_al_opengl_set_blender(d))  {
      _al_draw_pixel_memory(target, x, y, color);
      return;
   }

   vert[0] = x;
   vert[1] = y;

   color_array[0] = color->r;
   color_array[1] = color->g;
   color_array[2] = color->b;
   color_array[3] = color->a;

   vert_ptr_on(d, 2, GL_FLOAT, 2*sizeof(float), vert);
   color_ptr_on(d, 4, GL_FLOAT, 4*sizeof(float), color_array);

   // Should this be here if it's in the if above?
   if (!_al_opengl_set_blender(d)) {
      return;
   }

   glDrawArrays(GL_POINTS, 0, 1);

   vert_ptr_off(d);
   color_ptr_off(d);
}